

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::diffBasisSupported<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,int *point,double *x,double *diff_values,bool *isSupported)

{
  double dVar1;
  byte local_62;
  byte local_61;
  int local_54;
  int local_50;
  int k_1;
  int j_1;
  int j;
  double fval;
  bool local_35;
  int k;
  bool isDimSupported;
  bool *pbStack_30;
  int i;
  bool *isSupported_local;
  double *diff_values_local;
  double *x_local;
  int *point_local;
  GridLocalPolynomial *this_local;
  
  *isSupported = false;
  for (k = 0; k < (this->super_BaseCanonicalGrid).num_dimensions; k = k + 1) {
    diff_values[k] = 1.0;
  }
  local_35 = false;
  pbStack_30 = isSupported;
  isSupported_local = (bool *)diff_values;
  diff_values_local = x;
  x_local = (double *)point;
  point_local = (int *)this;
  for (fval._4_4_ = 0; fval._4_4_ < (this->super_BaseCanonicalGrid).num_dimensions;
      fval._4_4_ = fval._4_4_ + 1) {
    dVar1 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)4>
                      (this->order,*(int *)((long)x_local + (long)fval._4_4_ * 4),
                       diff_values_local[fval._4_4_],&local_35);
    local_61 = 1;
    if ((local_35 & 1U) == 0) {
      local_61 = *pbStack_30;
    }
    *pbStack_30 = (bool)(local_61 & 1);
    for (k_1 = 0; local_50 = fval._4_4_, k_1 < fval._4_4_; k_1 = k_1 + 1) {
      *(double *)(isSupported_local + (long)k_1 * 8) =
           dVar1 * *(double *)(isSupported_local + (long)k_1 * 8);
    }
    while (local_50 = local_50 + 1, local_50 < (this->super_BaseCanonicalGrid).num_dimensions) {
      *(double *)(isSupported_local + (long)local_50 * 8) =
           dVar1 * *(double *)(isSupported_local + (long)local_50 * 8);
    }
  }
  for (local_54 = 0; local_54 < (this->super_BaseCanonicalGrid).num_dimensions;
      local_54 = local_54 + 1) {
    dVar1 = RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)4>
                      (this->order,*(int *)((long)x_local + (long)local_54 * 4),
                       diff_values_local[local_54],&local_35);
    *(double *)(isSupported_local + (long)local_54 * 8) =
         dVar1 * *(double *)(isSupported_local + (long)local_54 * 8);
    local_62 = 1;
    if ((local_35 & 1U) == 0) {
      local_62 = *pbStack_30;
    }
    *pbStack_30 = (bool)(local_62 & 1);
  }
  return;
}

Assistant:

void diffBasisSupported(const int point[], const double x[], double diff_values[], bool &isSupported) const{
        isSupported = false;
        for(int i=0; i<num_dimensions; i++) diff_values[i] = 1.0;
        bool isDimSupported = false;
        for(int k=0; k<num_dimensions; k++) {
            double fval = RuleLocal::evalSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
            for(int j=0; j<k; j++) diff_values[j] *= fval;
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= fval;
        }
        for (int k=0; k<num_dimensions; k++) {
            diff_values[k] *= RuleLocal::diffSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
        }
    }